

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O2

const_iterator __thiscall
cppjieba::HMMSegment::NumbersRule(HMMSegment *this,const_iterator begin,const_iterator end)

{
  const_iterator pRVar1;
  
  if (begin->rune - 0x30 < 10) {
    pRVar1 = begin + 1;
    do {
      begin = pRVar1;
      if (begin == end) {
        return begin;
      }
      pRVar1 = begin + 1;
    } while (begin->rune == 0x2e || begin->rune - 0x30 < 10);
  }
  return begin;
}

Assistant:

RuneStrArray::const_iterator NumbersRule(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    Rune x = begin->rune;
    if ('0' <= x && x <= '9') {
      begin ++;
    } else {
      return begin;
    }
    while (begin != end) {
      x = begin->rune;
      if ( ('0' <= x && x <= '9') || x == '.') {
        begin++;
      } else {
        break;
      }
    }
    return begin;
  }